

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Fire_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::LE_Fire_PDU::SetEventIDSiteAppIncludedFlag(LE_Fire_PDU *this,KBOOL F)

{
  KBOOL F_local;
  LE_Fire_PDU *this_local;
  
  if (F != (KBOOL)((this->m_FireFlagUnion).m_ui8Flag >> 3 & 1)) {
    (this->m_FireFlagUnion).m_ui8Flag = (this->m_FireFlagUnion).m_ui8Flag & 0xf7 | F << 3;
    if (F) {
      (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength =
           (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength + 2;
    }
    else {
      (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength =
           (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength - 2;
    }
  }
  return;
}

Assistant:

void LE_Fire_PDU::SetEventIDSiteAppIncludedFlag( KBOOL F )
{
    if( ( KUINT8 )F == m_FireFlagUnion.m_ui8EventSiteAppId )return;

    m_FireFlagUnion.m_ui8EventSiteAppId = F;

    if( F )
    {
        m_ui16PDULength += 2; // 2 = This flag indicates the site and application fields are included.
    }
    else
    {
        m_ui16PDULength -= 2;
    }
}